

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_freeCDict(ZSTD_CDict *cdict)

{
  ZSTD_CDict *__ptr;
  ZSTD_freeFunction p_Var1;
  void *pvVar2;
  bool bVar3;
  
  if (cdict != (ZSTD_CDict *)0x0) {
    __ptr = (ZSTD_CDict *)(cdict->workspace).workspace;
    bVar3 = true;
    if (__ptr <= cdict) {
      bVar3 = (ZSTD_CDict *)(cdict->workspace).workspaceEnd <= cdict;
    }
    p_Var1 = (cdict->customMem).customFree;
    pvVar2 = (cdict->customMem).opaque;
    (cdict->workspace).initOnceStart = (void *)0x0;
    (cdict->workspace).allocFailed = '\0';
    *(undefined3 *)&(cdict->workspace).field_0x39 = 0;
    (cdict->workspace).workspaceOversizedDuration = 0;
    (cdict->workspace).tableValidEnd = (void *)0x0;
    (cdict->workspace).allocStart = (void *)0x0;
    (cdict->workspace).objectEnd = (void *)0x0;
    (cdict->workspace).tableEnd = (void *)0x0;
    (cdict->workspace).workspace = (void *)0x0;
    (cdict->workspace).workspaceEnd = (void *)0x0;
    (cdict->workspace).phase = ZSTD_cwksp_alloc_objects;
    (cdict->workspace).isStatic = ZSTD_cwksp_dynamic_alloc;
    if (__ptr != (ZSTD_CDict *)0x0) {
      if (p_Var1 == (ZSTD_freeFunction)0x0) {
        free(__ptr);
      }
      else {
        (*p_Var1)(pvVar2,__ptr);
      }
    }
    if (bVar3) {
      if (p_Var1 == (ZSTD_freeFunction)0x0) {
        free(cdict);
      }
      else {
        (*p_Var1)(pvVar2,cdict);
      }
    }
  }
  return 0;
}

Assistant:

size_t ZSTD_freeCDict(ZSTD_CDict* cdict)
{
    if (cdict==NULL) return 0;   /* support free on NULL */
    {   ZSTD_customMem const cMem = cdict->customMem;
        int cdictInWorkspace = ZSTD_cwksp_owns_buffer(&cdict->workspace, cdict);
        ZSTD_cwksp_free(&cdict->workspace, cMem);
        if (!cdictInWorkspace) {
            ZSTD_customFree(cdict, cMem);
        }
        return 0;
    }
}